

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O2

void __thiscall orphanage_tests::too_large_orphan_tx::test_method(too_large_orphan_tx *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  pointer pCVar5;
  undefined4 *puVar6;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 local_230 [16];
  undefined1 local_220 [48];
  char *local_1f0;
  char *local_1e8;
  assertion_result local_1e0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  CMutableTransaction tx;
  undefined1 local_168 [16];
  undefined1 *local_158;
  pointer local_150;
  TxOrphanage orphanage;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  orphanage.m_next_sweep.__d.__r = (duration)0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
  BulkTransaction(&tx,0x61a84);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x180;
  file.m_begin = (iterator)&local_1b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,msg);
  local_1e0.m_message.px = (element_type *)((ulong)local_1e0.m_message.px & 0xffffffffffffff00);
  local_1e0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_1e8 = "";
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  local_220._0_4_ = GetTransactionWeight((CTransaction *)local_168);
  pvVar4 = local_220;
  local_230._0_4_ = 0x61a84;
  pvVar3 = (iterator)0x2;
  pCVar5 = (pointer)local_230;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_1e0,&local_1f0,0x180,1,2,pvVar4,"GetTransactionWeight(CTransaction(tx))",
             (pointer)local_230,"MAX_STANDARD_TX_WEIGHT + 4");
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_220._32_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_220._40_8_ = "";
  local_220._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_220._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x181;
  file_00.m_begin = local_220 + 0x20;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)(local_220 + 0x10),msg_00);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_220);
  bVar2 = TxOrphanage::AddTx(&orphanage,(CTransactionRef *)local_220,0);
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230._0_8_ = "!orphanage.AddTx(MakeTransactionRef(tx), 0)";
  local_230._8_8_ = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_238 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_150 = (pointer)local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,(lazy_ostream *)local_168,1,0,WARN,(check_type)pCVar5,(size_t)&local_240,
             0x181);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::clear(&tx.vout);
  BulkTransaction(&tx,400000);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x185;
  file_01.m_begin = (iterator)&local_250;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_260,
             msg_01);
  local_1e0.m_message.px = (element_type *)((ulong)local_1e0.m_message.px & 0xffffffffffffff00);
  local_1e0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_268 = "";
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  local_220._0_4_ = GetTransactionWeight((CTransaction *)local_168);
  pvVar4 = local_220;
  puVar6 = &MAX_STANDARD_TX_WEIGHT;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_1e0,&local_270,0x185,1,2,pvVar4,"GetTransactionWeight(CTransaction(tx))",
             &MAX_STANDARD_TX_WEIGHT,"MAX_STANDARD_TX_WEIGHT");
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x186;
  file_02.m_begin = (iterator)&local_280;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_290,
             msg_02);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_220);
  bVar2 = TxOrphanage::AddTx(&orphanage,(CTransactionRef *)local_220,0);
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230._0_8_ = "orphanage.AddTx(MakeTransactionRef(tx), 0)";
  local_230._8_8_ = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_298 = "";
  local_150 = (pointer)local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,(lazy_ostream *)local_168,1,0,WARN,(check_type)puVar6,(size_t)&local_2a0,
             0x186);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8));
  CMutableTransaction::~CMutableTransaction(&tx);
  TxOrphanage::~TxOrphanage(&orphanage);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(too_large_orphan_tx)
{
    TxOrphanage orphanage;
    CMutableTransaction tx;
    tx.vin.resize(1);

    // check that txs larger than MAX_STANDARD_TX_WEIGHT are not added to the orphanage
    BulkTransaction(tx, MAX_STANDARD_TX_WEIGHT + 4);
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(tx)), MAX_STANDARD_TX_WEIGHT + 4);
    BOOST_CHECK(!orphanage.AddTx(MakeTransactionRef(tx), 0));

    tx.vout.clear();
    BulkTransaction(tx, MAX_STANDARD_TX_WEIGHT);
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(tx)), MAX_STANDARD_TX_WEIGHT);
    BOOST_CHECK(orphanage.AddTx(MakeTransactionRef(tx), 0));
}